

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O2

void __thiscall
dlib::add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>::
back_propagate_error
          (add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void> *this,
          tensor *x,tensor *gradient_input,zero_gradients zero_grads)

{
  resizable_tensor *this_00;
  bool bVar1;
  subnet_wrapper wsub;
  subnet_wrapper local_48;
  
  this_00 = &this->grad_final;
  bVar1 = have_same_dimensions(x,&this_00->super_tensor);
  if (!bVar1) {
    resizable_tensor::copy_size(this_00,x);
  }
  tensor::operator=(&this_00->super_tensor,0.0);
  local_48._sample_expansion_factor = this->_sample_expansion_factor;
  local_48.x = x;
  local_48.grad_final = this_00;
  resizable_tensor::copy_size(&this->params_grad,(tensor *)&this->details);
  con_<64l,7l,7l,2,2,0,0>::
  backward<dlib::add_layer<dlib::con_<64l,7l,7l,2,2,0,0>,dlib::input_rgb_image,void>::subnet_wrapper>
            ((con_<64l,7l,7l,2,2,0,0> *)&this->details,gradient_input,&local_48,
             &(this->params_grad).super_tensor);
  this->gradient_input_is_stale = zero_grads == yes;
  return;
}

Assistant:

void back_propagate_error(
            const tensor& x,
            const tensor& gradient_input,
            zero_gradients zero_grads = zero_gradients::yes
        )
        {
            // make sure grad_final is initialized to 0
            if (!have_same_dimensions(x, grad_final))
                grad_final.copy_size(x);
            grad_final = 0;  

            subnet_wrapper wsub(x, grad_final, _sample_expansion_factor);
            params_grad.copy_size(details.get_layer_params());
            impl::call_layer_backward(details, private_get_output(),
                gradient_input, wsub, static_cast<tensor&>(params_grad));

            // zero out get_gradient_input()
            gradient_input_is_stale = zero_grads == zero_gradients::yes;
        }